

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

void __thiscall
spirv_cross::Compiler::CombinedImageSamplerHandler::register_combined_image_sampler
          (CombinedImageSamplerHandler *this,SPIRFunction *caller,VariableID combined_module_id,
          VariableID image_id,VariableID sampler_id,bool depth)

{
  size_t *psVar1;
  Parameter *pPVar2;
  size_t sVar3;
  Compiler *pCVar4;
  undefined8 uVar5;
  CombinedImageSamplerParameter *pCVar6;
  Parameter *pPVar7;
  bool bVar8;
  bool bVar9;
  undefined2 uVar10;
  Dim DVar11;
  bool bVar12;
  undefined1 uVar13;
  ImageFormat IVar14;
  AccessQualifier AVar15;
  TypeID TVar16;
  TypeID TVar17;
  undefined4 uVar18;
  SPIRFunction *pSVar19;
  CombinedImageSamplerHandler *pCVar20;
  bool bVar21;
  uint32_t uVar22;
  uint32_t uVar23;
  SPIRType *pSVar24;
  SPIRType *pSVar25;
  SPIRType *pSVar26;
  CombinedImageSamplerParameter *pCVar27;
  undefined8 unaff_RBP;
  Parameter *pPVar28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2;
  undefined3 in_register_00000089;
  long lVar29;
  long lVar30;
  Parameter *pPVar31;
  CombinedImageSamplerParameter *pCVar32;
  VariableID VVar33;
  ID id;
  Parameter *pPVar34;
  VariableID VVar35;
  uint32_t ptr_type_id;
  TypeID local_f8;
  ID local_f4;
  undefined4 local_f0;
  uint32_t local_ec;
  ID local_e8;
  undefined4 local_e4;
  SPIRFunction *local_e0;
  ImageType *local_d8;
  SmallVector<unsigned_int,_8UL> *local_d0;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *local_c8;
  uint32_t *local_c0;
  undefined8 *local_b8;
  SmallVector<bool,_8UL> *local_b0;
  SmallVector<unsigned_int,_8UL> *local_a8;
  ulong local_a0;
  CombinedImageSamplerHandler *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_f0 = CONCAT31(in_register_00000089,depth);
  pPVar2 = (caller->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
  sVar3 = (caller->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size;
  pPVar7 = pPVar2 + sVar3;
  lVar29 = (long)sVar3 >> 2;
  pPVar31 = pPVar2;
  if (0 < lVar29) {
    pPVar31 = pPVar2 + lVar29 * 4;
    lVar30 = lVar29 + 1;
    pPVar34 = pPVar2 + 2;
    do {
      if (pPVar34[-2].id.id == image_id.id) {
        pPVar34 = pPVar34 + -2;
        goto LAB_003397fb;
      }
      if (pPVar34[-1].id.id == image_id.id) {
        pPVar34 = pPVar34 + -1;
        goto LAB_003397fb;
      }
      if ((pPVar34->id).id == image_id.id) goto LAB_003397fb;
      if (pPVar34[1].id.id == image_id.id) {
        pPVar34 = pPVar34 + 1;
        goto LAB_003397fb;
      }
      lVar30 = lVar30 + -1;
      pPVar34 = pPVar34 + 4;
    } while (1 < lVar30);
  }
  lVar30 = ((long)pPVar7 - (long)pPVar31 >> 2) * -0x3333333333333333;
  if (lVar30 == 1) {
LAB_003397ef:
    pPVar34 = pPVar31;
    if ((pPVar31->id).id != image_id.id) {
      pPVar34 = pPVar7;
    }
  }
  else {
    pPVar34 = pPVar31;
    if (lVar30 == 2) {
LAB_003397ce:
      if ((pPVar34->id).id != image_id.id) {
        pPVar31 = pPVar34 + 1;
        goto LAB_003397ef;
      }
    }
    else {
      pPVar34 = pPVar7;
      if ((lVar30 == 3) && (pPVar34 = pPVar31, (pPVar31->id).id != image_id.id)) {
        pPVar34 = pPVar31 + 1;
        goto LAB_003397ce;
      }
    }
  }
LAB_003397fb:
  pPVar31 = pPVar2;
  if (0 < lVar29) {
    pPVar31 = pPVar2 + lVar29 * 4;
    lVar29 = lVar29 + 1;
    pPVar28 = pPVar2 + 2;
    do {
      if (pPVar28[-2].id.id == sampler_id.id) {
        pPVar28 = pPVar28 + -2;
        goto LAB_0033989d;
      }
      if (pPVar28[-1].id.id == sampler_id.id) {
        pPVar28 = pPVar28 + -1;
        goto LAB_0033989d;
      }
      if ((pPVar28->id).id == sampler_id.id) goto LAB_0033989d;
      if (pPVar28[1].id.id == sampler_id.id) {
        pPVar28 = pPVar28 + 1;
        goto LAB_0033989d;
      }
      lVar29 = lVar29 + -1;
      pPVar28 = pPVar28 + 4;
    } while (1 < lVar29);
  }
  lVar29 = ((long)pPVar7 - (long)pPVar31 >> 2) * -0x3333333333333333;
  if (lVar29 == 1) {
LAB_00339891:
    pPVar28 = pPVar31;
    if ((pPVar31->id).id != sampler_id.id) {
      pPVar28 = pPVar7;
    }
  }
  else {
    pPVar28 = pPVar31;
    if (lVar29 == 2) {
LAB_00339870:
      if ((pPVar28->id).id != sampler_id.id) {
        pPVar31 = pPVar28 + 1;
        goto LAB_00339891;
      }
    }
    else {
      pPVar28 = pPVar7;
      if ((lVar29 == 3) && (pPVar28 = pPVar31, (pPVar31->id).id != sampler_id.id)) {
        pPVar28 = pPVar31 + 1;
        goto LAB_00339870;
      }
    }
  }
LAB_0033989d:
  local_e4 = (undefined4)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  VVar33.id = image_id.id;
  if (pPVar34 != pPVar7) {
    VVar33.id = (int)((ulong)((long)pPVar34 - (long)pPVar2) >> 2) * -0x33333333;
  }
  bVar8 = pPVar34 == pPVar7;
  VVar35.id = sampler_id.id;
  if (pPVar28 != pPVar7) {
    VVar35.id = (int)((ulong)((long)pPVar28 - (long)pPVar2) >> 2) * -0x33333333;
    local_e4 = 0;
  }
  bVar21 = SUB41(local_e4,0);
  if ((bVar8) && (bVar21 != false)) {
    return;
  }
  pCVar27 = (caller->combined_parameters).
            super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.ptr;
  sVar3 = (caller->combined_parameters).
          super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.buffer_size;
  pCVar6 = pCVar27 + sVar3;
  pCVar32 = pCVar27;
  if (0 < (long)sVar3 >> 2) {
    pCVar32 = (CombinedImageSamplerParameter *)
              ((long)&(pCVar27->id).id + (sVar3 * 0x10 & 0xffffffffffffffc0));
    lVar29 = ((long)sVar3 >> 2) + 1;
    pCVar27 = pCVar27 + 2;
    do {
      if ((((VVar33.id == pCVar27[-2].image_id.id) && (VVar35.id == pCVar27[-2].sampler_id.id)) &&
          (bVar8 == pCVar27[-2].global_image)) && (bVar21 == pCVar27[-2].global_sampler)) {
        pCVar27 = pCVar27 + -2;
        goto LAB_00339a48;
      }
      if (((VVar33.id == pCVar27[-1].image_id.id) && (VVar35.id == pCVar27[-1].sampler_id.id)) &&
         ((bVar8 == pCVar27[-1].global_image && (bVar21 == pCVar27[-1].global_sampler)))) {
        pCVar27 = pCVar27 + -1;
        goto LAB_00339a48;
      }
      if (((VVar33.id == (pCVar27->image_id).id) && (VVar35.id == (pCVar27->sampler_id).id)) &&
         ((bVar8 == pCVar27->global_image && (bVar21 == pCVar27->global_sampler))))
      goto LAB_00339a48;
      if ((((VVar33.id == pCVar27[1].image_id.id) && (VVar35.id == pCVar27[1].sampler_id.id)) &&
          (bVar8 == pCVar27[1].global_image)) && (bVar21 == pCVar27[1].global_sampler)) {
        pCVar27 = pCVar27 + 1;
        goto LAB_00339a48;
      }
      lVar29 = lVar29 + -1;
      pCVar27 = pCVar27 + 4;
    } while (1 < lVar29);
  }
  lVar29 = (long)pCVar6 - (long)pCVar32 >> 4;
  if (lVar29 != 1) {
    pCVar27 = pCVar32;
    if (lVar29 != 2) {
      pCVar27 = pCVar6;
      if ((lVar29 != 3) ||
         (((VVar33.id == (pCVar32->image_id).id && (VVar35.id == (pCVar32->sampler_id).id)) &&
          ((bVar8 == pCVar32->global_image && (pCVar27 = pCVar32, bVar21 == pCVar32->global_sampler)
           ))))) goto LAB_00339a48;
      pCVar27 = pCVar32 + 1;
    }
    if (((VVar33.id == (pCVar27->image_id).id) && (VVar35.id == (pCVar27->sampler_id).id)) &&
       ((bVar8 == pCVar27->global_image && (bVar21 == pCVar27->global_sampler)))) goto LAB_00339a48;
    pCVar32 = pCVar27 + 1;
  }
  pCVar27 = pCVar6;
  if ((((VVar33.id == (pCVar32->image_id).id) && (VVar35.id == (pCVar32->sampler_id).id)) &&
      (bVar8 == pCVar32->global_image)) && (pCVar27 = pCVar32, bVar21 != pCVar32->global_sampler)) {
    pCVar27 = pCVar6;
  }
LAB_00339a48:
  if (pCVar27 == pCVar6) {
    local_f4.id = combined_module_id.id;
    local_e8.id = sampler_id.id;
    local_e0 = caller;
    uVar22 = ParsedIR::increase_bound_by(&this->compiler->ir,3);
    local_f8.id = uVar22 + 1;
    pCVar4 = this->compiler;
    local_ec = uVar22;
    uVar23 = expression_type_id(pCVar4,image_id.id);
    pSVar24 = Variant::get<spirv_cross::SPIRType>
                        ((pCVar4->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + uVar23);
    local_a0 = (ulong)uVar22;
    pSVar25 = set<spirv_cross::SPIRType>(this->compiler,uVar22);
    local_98 = this;
    pSVar26 = set<spirv_cross::SPIRType>(this->compiler,local_f8.id);
    (pSVar25->super_IVariant).self.id = (pSVar24->super_IVariant).self.id;
    local_b8 = (undefined8 *)&(pSVar25->super_IVariant).field_0xc;
    uVar22 = pSVar24->vecsize;
    uVar23 = pSVar24->columns;
    *(undefined8 *)&(pSVar25->super_IVariant).field_0xc =
         *(undefined8 *)&(pSVar24->super_IVariant).field_0xc;
    pSVar25->vecsize = uVar22;
    pSVar25->columns = uVar23;
    local_a8 = &pSVar25->array;
    SmallVector<unsigned_int,_8UL>::operator=(local_a8,&pSVar24->array);
    local_b0 = &pSVar25->array_size_literal;
    SmallVector<bool,_8UL>::operator=(local_b0,&pSVar24->array_size_literal);
    local_c0 = &pSVar25->pointer_depth;
    bVar21 = pSVar24->pointer;
    bVar9 = pSVar24->forward_pointer;
    uVar10 = *(undefined2 *)&pSVar24->field_0x7e;
    pSVar25->pointer_depth = pSVar24->pointer_depth;
    pSVar25->pointer = bVar21;
    pSVar25->forward_pointer = bVar9;
    *(undefined2 *)&pSVar25->field_0x7e = uVar10;
    pSVar25->storage = pSVar24->storage;
    local_c8 = &pSVar25->member_types;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
              (local_c8,&pSVar24->member_types);
    local_d0 = &pSVar25->member_type_index_redirection;
    SmallVector<unsigned_int,_8UL>::operator=(local_d0,&pSVar24->member_type_index_redirection);
    local_d8 = &pSVar25->image;
    DVar11 = (pSVar24->image).dim;
    bVar21 = (pSVar24->image).depth;
    bVar9 = (pSVar24->image).arrayed;
    bVar12 = (pSVar24->image).ms;
    uVar13 = (pSVar24->image).field_0xb;
    uVar22 = (pSVar24->image).sampled;
    IVar14 = (pSVar24->image).format;
    AVar15 = (pSVar24->image).access;
    TVar16.id = (pSVar24->type_alias).id;
    TVar17.id = (pSVar24->parent_type).id;
    (pSVar25->image).type = (TypeID)(pSVar24->image).type.id;
    (pSVar25->image).dim = DVar11;
    (pSVar25->image).depth = bVar21;
    (pSVar25->image).arrayed = bVar9;
    (pSVar25->image).ms = bVar12;
    (pSVar25->image).field_0xb = uVar13;
    (pSVar25->image).sampled = uVar22;
    (pSVar25->image).format = IVar14;
    (pSVar25->image).access = AVar15;
    pSVar25->type_alias = (TypeID)TVar16.id;
    pSVar25->parent_type = (TypeID)TVar17.id;
    if (pSVar24 != pSVar25) {
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&pSVar25->member_name_cache,&(pSVar24->member_name_cache)._M_h);
    }
    id.id = (int)local_a0 + 2;
    (pSVar25->super_IVariant).self.id = local_ec;
    *(undefined4 *)&(pSVar25->super_IVariant).field_0xc = 0x11;
    pSVar25->pointer = false;
    pSVar25->storage = StorageClassGeneric;
    (pSVar25->image).depth = SUB41(local_f0,0);
    (pSVar26->super_IVariant).self.id = local_ec;
    uVar5 = local_b8[1];
    *(undefined8 *)&(pSVar26->super_IVariant).field_0xc = *local_b8;
    pSVar26->vecsize = (int)uVar5;
    pSVar26->columns = (int)((ulong)uVar5 >> 0x20);
    SmallVector<unsigned_int,_8UL>::operator=(&pSVar26->array,local_a8);
    SmallVector<bool,_8UL>::operator=(&pSVar26->array_size_literal,local_b0);
    uVar5 = *(undefined8 *)local_c0;
    pSVar26->pointer_depth = (int)uVar5;
    pSVar26->pointer = (bool)(char)((ulong)uVar5 >> 0x20);
    pSVar26->forward_pointer = (bool)(char)((ulong)uVar5 >> 0x28);
    *(short *)&pSVar26->field_0x7e = (short)((ulong)uVar5 >> 0x30);
    pSVar26->storage = local_c0[2];
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
              (&pSVar26->member_types,local_c8);
    SmallVector<unsigned_int,_8UL>::operator=(&pSVar26->member_type_index_redirection,local_d0);
    DVar11 = local_d8->dim;
    bVar21 = local_d8->depth;
    bVar9 = local_d8->arrayed;
    bVar12 = local_d8->ms;
    uVar13 = local_d8->field_0xb;
    uVar22 = local_d8->sampled;
    IVar14 = local_d8->format;
    AVar15 = local_d8->access;
    uVar5 = *(undefined8 *)&local_d8[1].type;
    (pSVar26->image).type = (TypeID)(local_d8->type).id;
    (pSVar26->image).dim = DVar11;
    (pSVar26->image).depth = bVar21;
    (pSVar26->image).arrayed = bVar9;
    (pSVar26->image).ms = bVar12;
    (pSVar26->image).field_0xb = uVar13;
    (pSVar26->image).sampled = uVar22;
    (pSVar26->image).format = IVar14;
    (pSVar26->image).access = AVar15;
    *(undefined8 *)&pSVar26->type_alias = uVar5;
    if (pSVar25 != pSVar26) {
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&pSVar26->member_name_cache,&(pSVar25->member_name_cache)._M_h);
    }
    pCVar20 = local_98;
    pSVar26->pointer = true;
    pSVar26->storage = StorageClassUniformConstant;
    (pSVar26->parent_type).id = local_ec;
    local_70._M_dataplus._M_p._0_4_ = 7;
    ts_2 = &local_90;
    local_90._M_dataplus._M_p._0_4_ = 0;
    set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int>
              (local_98->compiler,id.id,&local_f8.id,(StorageClass *)&local_70,(int *)ts_2);
    bVar21 = ParsedIR::has_decoration(&pCVar20->compiler->ir,local_e8,DecorationRelaxedPrecision);
    if (((bVar21) ||
        (bVar21 = ParsedIR::has_decoration
                            (&pCVar20->compiler->ir,(ID)image_id.id,DecorationRelaxedPrecision),
        bVar21)) ||
       ((local_f4.id != 0 &&
        (bVar21 = ParsedIR::has_decoration
                            (&pCVar20->compiler->ir,local_f4,DecorationRelaxedPrecision), bVar21))))
    {
      ParsedIR::set_decoration(&pCVar20->compiler->ir,id,DecorationRelaxedPrecision,0);
    }
    pCVar4 = pCVar20->compiler;
    (*pCVar4->_vptr_Compiler[6])(&local_90,pCVar4,(ulong)image_id.id,1);
    (*pCVar20->compiler->_vptr_Compiler[6])(&local_50,pCVar20->compiler,(ulong)local_e8.id,1);
    join<char_const(&)[21],std::__cxx11::string,std::__cxx11::string>
              (&local_70,(spirv_cross *)"SPIRV_Cross_Combined",(char (*) [21])&local_90,&local_50,
               ts_2);
    uVar18 = local_e4;
    ParsedIR::set_name(&pCVar4->ir,id,&local_70);
    pSVar19 = local_e0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_) !=
        &local_70.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_90._M_dataplus._M_p._4_4_,local_90._M_dataplus._M_p._0_4_) !=
        &local_90.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_90._M_dataplus._M_p._4_4_,local_90._M_dataplus._M_p._0_4_));
    }
    SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL>::reserve
              (&pSVar19->combined_parameters,
               (pSVar19->combined_parameters).
               super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.
               buffer_size + 1);
    TVar16.id = local_f8.id;
    pCVar6 = (pSVar19->combined_parameters).
             super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.ptr;
    sVar3 = (pSVar19->combined_parameters).
            super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.buffer_size;
    pCVar6[sVar3].id.id = id.id;
    pCVar6[sVar3].image_id.id = VVar33.id;
    pCVar6[sVar3].sampler_id.id = VVar35.id;
    pCVar6[sVar3].global_image = bVar8;
    pCVar6[sVar3].global_sampler = SUB41(uVar18,0);
    pCVar6[sVar3].depth = SUB41(local_f0,0);
    psVar1 = &(pSVar19->combined_parameters).
              super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.buffer_size
    ;
    *psVar1 = *psVar1 + 1;
    SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::reserve
              (&pSVar19->shadow_arguments,
               (pSVar19->shadow_arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
               buffer_size + 1);
    pPVar7 = (pSVar19->shadow_arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
    sVar3 = (pSVar19->shadow_arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
            buffer_size;
    pPVar7[sVar3].type.id = TVar16.id;
    pPVar7[sVar3].id.id = id.id;
    pPVar7[sVar3].read_count = 0;
    pPVar7[sVar3].write_count = 0;
    pPVar7[sVar3].alias_global_variable = true;
    psVar1 = &(pSVar19->shadow_arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
              buffer_size;
    *psVar1 = *psVar1 + 1;
  }
  return;
}

Assistant:

void Compiler::CombinedImageSamplerHandler::register_combined_image_sampler(SPIRFunction &caller,
                                                                            VariableID combined_module_id,
                                                                            VariableID image_id, VariableID sampler_id,
                                                                            bool depth)
{
	// We now have a texture ID and a sampler ID which will either be found as a global
	// or a parameter in our own function. If both are global, they will not need a parameter,
	// otherwise, add it to our list.
	SPIRFunction::CombinedImageSamplerParameter param = {
		0u, image_id, sampler_id, true, true, depth,
	};

	auto texture_itr = find_if(begin(caller.arguments), end(caller.arguments),
	                           [image_id](const SPIRFunction::Parameter &p) { return p.id == image_id; });
	auto sampler_itr = find_if(begin(caller.arguments), end(caller.arguments),
	                           [sampler_id](const SPIRFunction::Parameter &p) { return p.id == sampler_id; });

	if (texture_itr != end(caller.arguments))
	{
		param.global_image = false;
		param.image_id = uint32_t(texture_itr - begin(caller.arguments));
	}

	if (sampler_itr != end(caller.arguments))
	{
		param.global_sampler = false;
		param.sampler_id = uint32_t(sampler_itr - begin(caller.arguments));
	}

	if (param.global_image && param.global_sampler)
		return;

	auto itr = find_if(begin(caller.combined_parameters), end(caller.combined_parameters),
	                   [&param](const SPIRFunction::CombinedImageSamplerParameter &p) {
		                   return param.image_id == p.image_id && param.sampler_id == p.sampler_id &&
		                          param.global_image == p.global_image && param.global_sampler == p.global_sampler;
	                   });

	if (itr == end(caller.combined_parameters))
	{
		uint32_t id = compiler.ir.increase_bound_by(3);
		auto type_id = id + 0;
		auto ptr_type_id = id + 1;
		auto combined_id = id + 2;
		auto &base = compiler.expression_type(image_id);
		auto &type = compiler.set<SPIRType>(type_id);
		auto &ptr_type = compiler.set<SPIRType>(ptr_type_id);

		type = base;
		type.self = type_id;
		type.basetype = SPIRType::SampledImage;
		type.pointer = false;
		type.storage = StorageClassGeneric;
		type.image.depth = depth;

		ptr_type = type;
		ptr_type.pointer = true;
		ptr_type.storage = StorageClassUniformConstant;
		ptr_type.parent_type = type_id;

		// Build new variable.
		compiler.set<SPIRVariable>(combined_id, ptr_type_id, StorageClassFunction, 0);

		// Inherit RelaxedPrecision.
		// If any of OpSampledImage, underlying image or sampler are marked, inherit the decoration.
		bool relaxed_precision =
		    compiler.has_decoration(sampler_id, DecorationRelaxedPrecision) ||
		    compiler.has_decoration(image_id, DecorationRelaxedPrecision) ||
		    (combined_module_id && compiler.has_decoration(combined_module_id, DecorationRelaxedPrecision));

		if (relaxed_precision)
			compiler.set_decoration(combined_id, DecorationRelaxedPrecision);

		param.id = combined_id;

		compiler.set_name(combined_id,
		                  join("SPIRV_Cross_Combined", compiler.to_name(image_id), compiler.to_name(sampler_id)));

		caller.combined_parameters.push_back(param);
		caller.shadow_arguments.push_back({ ptr_type_id, combined_id, 0u, 0u, true });
	}
}